

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getarg_tests.cpp
# Opt level: O0

void __thiscall getarg_tests::boolarg::test_method(boolarg *this)

{
  long lVar1;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  __l;
  bool bVar2;
  long in_FS_OFFSET;
  pair<const_char_*,_ArgsManager::Flags> pVar3;
  ArgsManager *in_stack_ffffffffffffe808;
  undefined7 in_stack_ffffffffffffe810;
  undefined1 in_stack_ffffffffffffe817;
  undefined7 in_stack_ffffffffffffe818;
  undefined1 in_stack_ffffffffffffe81f;
  char (*in_stack_ffffffffffffe820) [5];
  const_string *in_stack_ffffffffffffe830;
  pair<const_char_*,_ArgsManager::Flags> *in_stack_ffffffffffffe838;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  *in_stack_ffffffffffffe840;
  undefined7 in_stack_ffffffffffffe848;
  undefined1 in_stack_ffffffffffffe84f;
  ArgsManager *in_stack_ffffffffffffe850;
  undefined7 in_stack_ffffffffffffe858;
  undefined1 in_stack_ffffffffffffe85f;
  string *in_stack_ffffffffffffe890;
  ArgsManager *in_stack_ffffffffffffe898;
  ArgsManager *pAVar4;
  ArgsManager *local_1398;
  boolarg *this_local;
  const_string local_1348 [2];
  lazy_ostream local_1328 [2];
  allocator<char> local_1301;
  assertion_result local_1300 [2];
  const_string local_12c8 [2];
  lazy_ostream local_12a8 [2];
  allocator<char> local_1281;
  assertion_result local_1280 [2];
  undefined1 local_1241 [33];
  lazy_ostream local_1220 [2];
  allocator<char> local_11f9;
  assertion_result local_11f8 [2];
  const_string local_11c0 [2];
  lazy_ostream local_11a0 [2];
  allocator<char> local_1179;
  assertion_result local_1178 [2];
  allocator<char> local_1139;
  const_string local_1138 [2];
  lazy_ostream local_1118 [2];
  allocator<char> local_10f1;
  assertion_result local_10f0 [2];
  const_string local_10b8 [2];
  lazy_ostream local_1098 [2];
  allocator<char> local_1071;
  assertion_result local_1070 [2];
  allocator<char> local_1031;
  const_string local_1030 [2];
  lazy_ostream local_1010;
  undefined8 local_1000;
  allocator<char> local_fe9;
  assertion_result local_fe8 [2];
  const_string local_fb0 [2];
  lazy_ostream local_f90 [2];
  allocator<char> local_f69;
  assertion_result local_f68 [2];
  allocator<char> local_f29;
  const_string local_f28 [2];
  lazy_ostream local_f08 [2];
  allocator<char> local_ee1;
  assertion_result local_ee0 [2];
  const_string local_ea8 [2];
  lazy_ostream local_e88 [2];
  allocator<char> local_e61;
  assertion_result local_e60 [2];
  allocator<char> local_e21;
  const_string local_e20 [2];
  lazy_ostream local_e00 [2];
  allocator<char> local_dd9;
  assertion_result local_dd8 [2];
  const_string local_da0 [2];
  lazy_ostream local_d80 [2];
  allocator<char> local_d59;
  assertion_result local_d58 [2];
  allocator<char> local_d19;
  const_string local_d18 [2];
  lazy_ostream local_cf8 [2];
  allocator<char> local_cd1;
  assertion_result local_cd0 [2];
  const_string local_c98 [2];
  lazy_ostream local_c78 [2];
  allocator<char> local_c51;
  assertion_result local_c50 [2];
  allocator<char> local_c11;
  const_string local_c10 [2];
  lazy_ostream local_bf0 [2];
  allocator<char> local_bc9;
  assertion_result local_bc8 [2];
  const_string local_b90 [2];
  lazy_ostream local_b70 [2];
  allocator<char> local_b49;
  assertion_result local_b48 [2];
  allocator<char> local_b09;
  const_string local_b08 [2];
  lazy_ostream local_ae8 [2];
  allocator<char> local_ac1;
  assertion_result local_ac0 [2];
  const_string local_a88 [2];
  lazy_ostream local_a68 [2];
  allocator<char> local_a41;
  assertion_result local_a40 [2];
  allocator<char> local_a01;
  const_string local_a00 [2];
  lazy_ostream local_9e0 [2];
  allocator<char> local_9b9;
  assertion_result local_9b8 [2];
  const_string local_980 [2];
  lazy_ostream local_960 [2];
  allocator<char> local_939;
  assertion_result local_938 [2];
  const_string local_900 [2];
  lazy_ostream local_8e0 [2];
  allocator<char> local_8b9;
  assertion_result local_8b8 [2];
  const_string local_880 [2];
  lazy_ostream local_860 [2];
  allocator<char> local_839;
  assertion_result local_838 [2];
  const_string local_800 [2];
  lazy_ostream local_7e0 [2];
  allocator<char> local_7b9;
  assertion_result local_7b8 [2];
  const_string local_780 [2];
  lazy_ostream local_760 [2];
  allocator<char> local_739;
  assertion_result local_738 [2];
  allocator<char> local_6fa [26];
  char *local_6e0;
  Flags local_6d8;
  undefined4 local_6cc;
  pair<const_char_*,_ArgsManager::Flags> foo;
  undefined1 local_278 [40];
  ArgsManager local_args;
  
  local_1000 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::ArgsManager(in_stack_ffffffffffffe808);
  local_6cc = 1;
  pVar3 = std::make_pair<char_const(&)[5],ArgsManager::Flags>
                    (in_stack_ffffffffffffe820,
                     (Flags *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818));
  local_6e0 = pVar3.first;
  local_6d8 = pVar3.second;
  foo.first = local_6e0;
  foo.second = local_6d8;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
  ::pair<const_char_*,_ArgsManager::Flags,_true>
            (in_stack_ffffffffffffe840,in_stack_ffffffffffffe838);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
               *)in_stack_ffffffffffffe808);
  __l._M_len._0_7_ = in_stack_ffffffffffffe858;
  __l._M_array = (iterator)in_stack_ffffffffffffe850;
  __l._M_len._7_1_ = in_stack_ffffffffffffe85f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),__l,
           (allocator_type *)in_stack_ffffffffffffe840);
  SetupArgs(in_stack_ffffffffffffe850,
            (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
             *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818));
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>
                *)in_stack_ffffffffffffe808);
  local_1398 = &local_args;
  do {
    local_1398 = (ArgsManager *)&local_1398[-1].m_cached_network_datadir_path;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
             *)in_stack_ffffffffffffe808);
  } while (local_1398 != (ArgsManager *)local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
             (char *)in_stack_ffffffffffffe850,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
  ResetArgs(in_stack_ffffffffffffe898,in_stack_ffffffffffffe890);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe808);
  std::allocator<char>::~allocator(local_6fa);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_738,local_760,local_780,0xa7,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_739);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7b8,local_7e0,local_800,0xa8,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_7b9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_838,local_860,local_880,0xaa,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_839);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8b8,local_8e0,local_900,0xab,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_8b9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_938,local_960,local_980,0xad,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_939);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9b8,local_9e0,local_a00,0xae,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_9b9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
             (char *)in_stack_ffffffffffffe850,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
  ResetArgs(in_stack_ffffffffffffe898,in_stack_ffffffffffffe890);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe808);
  std::allocator<char>::~allocator(&local_a01);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a40,local_a68,local_a88,0xb1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_a41);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ac0,local_ae8,local_b08,0xb2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_ac1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
             (char *)in_stack_ffffffffffffe850,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
  ResetArgs(in_stack_ffffffffffffe898,in_stack_ffffffffffffe890);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe808);
  std::allocator<char>::~allocator(&local_b09);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b48,local_b70,local_b90,0xb5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_b49);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_bc8,local_bf0,local_c10,0xb6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_bc9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
             (char *)in_stack_ffffffffffffe850,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
  ResetArgs(in_stack_ffffffffffffe898,in_stack_ffffffffffffe890);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe808);
  std::allocator<char>::~allocator(&local_c11);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c50,local_c78,local_c98,0xba,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_c51);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cd0,local_cf8,local_d18,0xbb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_cd1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
             (char *)in_stack_ffffffffffffe850,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
  ResetArgs(in_stack_ffffffffffffe898,in_stack_ffffffffffffe890);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe808);
  std::allocator<char>::~allocator(&local_d19);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d58,local_d80,local_da0,0xbe,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_d59);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_dd8,local_e00,local_e20,0xbf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_dd9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
             (char *)in_stack_ffffffffffffe850,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
  ResetArgs(in_stack_ffffffffffffe898,in_stack_ffffffffffffe890);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe808);
  std::allocator<char>::~allocator(&local_e21);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e60,local_e88,local_ea8,0xc2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_e61);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ee0,local_f08,local_f28,0xc3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_ee1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
             (char *)in_stack_ffffffffffffe850,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
  ResetArgs(in_stack_ffffffffffffe898,in_stack_ffffffffffffe890);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe808);
  std::allocator<char>::~allocator(&local_f29);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_f68,local_f90,local_fb0,0xc6,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_f69);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_fe8,&local_1010,local_1030,199,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_fe9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
             (char *)in_stack_ffffffffffffe850,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
  ResetArgs(in_stack_ffffffffffffe898,in_stack_ffffffffffffe890);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe808);
  std::allocator<char>::~allocator(&local_1031);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1070,local_1098,local_10b8,0xca,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_1071);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_10f0,local_1118,local_1138,0xcb,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_10f1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
             (char *)in_stack_ffffffffffffe850,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
  ResetArgs(in_stack_ffffffffffffe898,in_stack_ffffffffffffe890);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe808);
  std::allocator<char>::~allocator(&local_1139);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1178,local_11a0,local_11c0,0xcf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_1179);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_11f8,local_1220,(const_string *)(local_1241 + 1),0xd0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_11f9);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pAVar4 = (ArgsManager *)local_1241;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
             (char *)in_stack_ffffffffffffe850,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
  ResetArgs(pAVar4,in_stack_ffffffffffffe890);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe808);
  std::allocator<char>::~allocator((allocator<char> *)local_1241);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    ArgsManager::GetBoolArg
              ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1280,local_12a8,local_12c8,0xd3,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_1281);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
               (const_string *)in_stack_ffffffffffffe840,(size_t)in_stack_ffffffffffffe838,
               in_stack_ffffffffffffe830);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_ffffffffffffe85f,in_stack_ffffffffffffe858),
               (char *)in_stack_ffffffffffffe850,
               (allocator<char> *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848));
    in_stack_ffffffffffffe85f =
         ArgsManager::GetBoolArg
                   ((ArgsManager *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
                    (string *)in_stack_ffffffffffffe808,(bool)in_stack_ffffffffffffe81f);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (bool)in_stack_ffffffffffffe817);
    in_stack_ffffffffffffe850 = (ArgsManager *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    boost::unit_test::operator<<
              ((lazy_ostream *)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (basic_cstring<const_char> *)in_stack_ffffffffffffe808);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)
               CONCAT17(in_stack_ffffffffffffe81f,in_stack_ffffffffffffe818),
               (pointer)CONCAT17(in_stack_ffffffffffffe817,in_stack_ffffffffffffe810),
               (unsigned_long)in_stack_ffffffffffffe808);
    in_stack_ffffffffffffe808 = (ArgsManager *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_1300,local_1328,local_1348,0xd4,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffe808);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffe808);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe808);
    std::allocator<char>::~allocator(&local_1301);
    in_stack_ffffffffffffe84f = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)in_stack_ffffffffffffe84f);
  ArgsManager::~ArgsManager(in_stack_ffffffffffffe808);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(boolarg)
{
    ArgsManager local_args;

    const auto foo = std::make_pair("-foo", ArgsManager::ALLOW_ANY);
    SetupArgs(local_args, {foo});
    ResetArgs(local_args, "-foo");
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));

    BOOST_CHECK(!local_args.GetBoolArg("-fo", false));
    BOOST_CHECK(local_args.GetBoolArg("-fo", true));

    BOOST_CHECK(!local_args.GetBoolArg("-fooo", false));
    BOOST_CHECK(local_args.GetBoolArg("-fooo", true));

    ResetArgs(local_args, "-foo=0");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-foo=1");
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));

    // New 0.6 feature: auto-map -nosomething to !-something:
    ResetArgs(local_args, "-nofoo");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-nofoo=1");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-foo -nofoo"); // -nofoo should win
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-foo=1 -nofoo=1"); // -nofoo should win
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "-foo=0 -nofoo=0"); // -nofoo=0 should win
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));

    // New 0.6 feature: treat -- same as -:
    ResetArgs(local_args, "--foo=1");
    BOOST_CHECK(local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(local_args.GetBoolArg("-foo", true));

    ResetArgs(local_args, "--nofoo=1");
    BOOST_CHECK(!local_args.GetBoolArg("-foo", false));
    BOOST_CHECK(!local_args.GetBoolArg("-foo", true));
}